

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

value_type * __thiscall
poplar::
map<poplar::compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
::update(map<poplar::compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
         *this,char_range key)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  char_range *key_00;
  type *ppiVar5;
  type_conflict *ptVar6;
  reference pvVar7;
  value_type_conflict5 *pvVar8;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  byte *in_RDI;
  pair<const_int_*,_unsigned_long> pVar9;
  int *vptr;
  type_conflict *match;
  type *vptr_1;
  uint64_t node_id;
  map<poplar::compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  *in_stack_fffffffffffffc78;
  map<poplar::compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  *in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffcb8 [16];
  compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_fffffffffffffcc8;
  uint64_t in_stack_fffffffffffffd08;
  compact_bonsai_nlm<int,_16UL> *in_stack_fffffffffffffd10;
  uint64_t *in_stack_fffffffffffffd18;
  map<poplar::compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  *in_stack_fffffffffffffd20;
  char_range *in_stack_fffffffffffffd28;
  uint64_t in_stack_fffffffffffffd30;
  compact_bonsai_nlm<int,_16UL> *in_stack_fffffffffffffd38;
  uint64_t in_stack_fffffffffffffe70;
  uint32_t in_stack_fffffffffffffe7c;
  map<poplar::compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  *in_stack_fffffffffffffe80;
  char_range local_18;
  value_type_conflict5 *local_8;
  
  local_18.begin = in_RSI;
  local_18.end = in_RDX;
  bVar2 = char_range::empty(&local_18);
  if (bVar2) {
    uVar3 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffc80,&in_stack_fffffffffffffc78->is_ready_);
    __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
  }
  if (local_18.end[-1] != '\0') {
    uVar3 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffc80,&in_stack_fffffffffffffc78->is_ready_);
    __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
  }
  uVar4 = compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
          ::size((compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                  *)(in_RDI + 0x10));
  if (uVar4 == 0) {
    if ((*in_RDI & 1) == 0) {
      map(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
      operator=(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      ~map(in_stack_fffffffffffffc80);
    }
    *(long *)(in_RDI + 0x2a0) = *(long *)(in_RDI + 0x2a0) + 1;
    compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
    ::add_root((compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                *)(in_RDI + 0x10));
    compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
    ::get_root((compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                *)(in_RDI + 0x10));
    local_8 = compact_bonsai_nlm<int,_16UL>::insert
                        (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                         in_stack_fffffffffffffd28);
  }
  else {
    key_00 = (char_range *)
             compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             ::get_root((compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                         *)(in_RDI + 0x10));
    while (bVar2 = char_range::empty(&local_18), ((bVar2 ^ 0xffU) & 1) != 0) {
      compact_bonsai_nlm<int,_16UL>::compare
                (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,key_00);
      ppiVar5 = std::get<0ul,int_const*,unsigned_long>((pair<const_int_*,_unsigned_long> *)0x1cc749)
      ;
      ptVar6 = std::get<1ul,int_const*,unsigned_long>((pair<const_int_*,_unsigned_long> *)0x1cc758);
      if (*ppiVar5 != (type)0x0) {
        return *ppiVar5;
      }
      local_18.begin = local_18.begin + *ptVar6;
      while (*(ulong *)(in_RDI + 8) <= *ptVar6) {
        bVar2 = compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                ::add_child(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcb8._8_8_,
                            in_stack_fffffffffffffcb8._0_8_);
        if (bVar2) {
          expand_if_needed_(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        }
        *ptVar6 = *ptVar6 - *(long *)(in_RDI + 8);
      }
      pvVar7 = std::array<unsigned_char,_256UL>::operator[]
                         ((array<unsigned_char,_256UL> *)in_stack_fffffffffffffc80,
                          (size_type)in_stack_fffffffffffffc78);
      if (*pvVar7 == 0xff) {
        iVar1 = *(int *)(in_RDI + 0x298);
        *(int *)(in_RDI + 0x298) = iVar1 + 1;
        pvVar7 = std::array<unsigned_char,_256UL>::operator[]
                           ((array<unsigned_char,_256UL> *)in_stack_fffffffffffffc80,
                            (size_type)in_stack_fffffffffffffc78);
        *pvVar7 = (value_type_conflict4)iVar1;
        if (*(int *)(in_RDI + 0x298) == 0xff) {
          uVar3 = __cxa_allocate_exception(0x10);
          exception::exception
                    ((exception *)in_stack_fffffffffffffc80,&in_stack_fffffffffffffc78->is_ready_);
          __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
        }
      }
      in_stack_fffffffffffffc80 =
           (map<poplar::compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
            *)(in_RDI + 0x10);
      make_symb_(in_stack_fffffffffffffc80,(uint8_t)((ulong)in_stack_fffffffffffffc78 >> 0x38),
                 0x1cc913);
      bVar2 = compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              ::add_child(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcb8._8_8_,
                          in_stack_fffffffffffffcb8._0_8_);
      if (bVar2) {
        expand_if_needed_(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        local_18.begin = local_18.begin + 1;
        *(long *)(in_RDI + 0x2a0) = *(long *)(in_RDI + 0x2a0) + 1;
        pvVar8 = compact_bonsai_nlm<int,_16UL>::insert
                           (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                            in_stack_fffffffffffffd28);
        return pvVar8;
      }
      local_18.begin = local_18.begin + 1;
    }
    pVar9 = compact_bonsai_nlm<int,_16UL>::compare
                      (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,key_00);
    local_8 = pVar9.first;
    if (local_8 == (value_type_conflict5 *)0x0) {
      local_8 = (value_type_conflict5 *)0x0;
    }
  }
  return local_8;
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }